

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<Lesson,_std::allocator<Lesson>_> *
find_free_spot_for_lesson
          (vector<Lesson,_std::allocator<Lesson>_> *__return_storage_ptr__,Group *group,
          string *lesson_name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>_>_>_>
          *possible_places,bool doubled)

{
  bool bVar1;
  vector<Lesson,_std::allocator<Lesson>_> *this;
  pointer pLVar2;
  pointer pLVar3;
  bool bVar4;
  __type _Var5;
  Lesson *pLVar6;
  pointer piVar7;
  _Base_ptr p_Var8;
  undefined7 in_register_00000081;
  iterator __begin4;
  pointer pLVar9;
  pointer pLVar10;
  bool bVar11;
  allocator local_262;
  allocator local_261;
  vector<Lesson,_std::allocator<Lesson>_> *local_260;
  _Rb_tree_node_base *local_258;
  undefined4 local_24c;
  vector<Lesson,_std::allocator<Lesson>_> all_lessons_with_this_name;
  vector<int,_std::allocator<int>_> busy_ids;
  string local_200;
  Lesson lesson;
  string local_138;
  string local_118;
  string local_f8;
  Lesson lesson_2;
  
  local_24c = (undefined4)CONCAT71(in_register_00000081,doubled);
  busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Lesson,_std::allocator<Lesson>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Lesson,_std::allocator<Lesson>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Lesson,_std::allocator<Lesson>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar9 = (group->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_260 = __return_storage_ptr__;
  local_258 = (_Rb_tree_node_base *)possible_places;
  for (pLVar10 = (group->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
                 super__Vector_impl_data._M_start; pLVar10 != pLVar9; pLVar10 = pLVar10 + 1) {
    Lesson::Lesson(&lesson,pLVar10);
    bVar4 = std::operator!=(&lesson.subject,"");
    if (bVar4) {
      lesson_2.lesson_id._0_4_ = (undefined4)lesson.lesson_id;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&busy_ids,(int *)&lesson_2);
    }
    Lesson::~Lesson(&lesson);
  }
  p_Var8 = (((_Rep_type *)&local_258->_M_color)->_M_impl).super__Rb_tree_header._M_header._M_left;
  local_258 = &(((_Rep_type *)&local_258->_M_color)->_M_impl).super__Rb_tree_header._M_header;
  bVar4 = false;
  do {
    if (p_Var8 == local_258) {
      std::__cxx11::string::string((string *)&local_200,"",(allocator *)&lesson_2);
      std::__cxx11::string::string((string *)&local_f8,"",(allocator *)&all_lessons_with_this_name);
      std::__cxx11::string::string((string *)&local_118,"",&local_261);
      std::__cxx11::string::string((string *)&local_138,"",&local_262);
      Lesson::Lesson(&lesson,0,false,false,false,&local_200,&local_f8,&local_118,&local_138);
      std::vector<Lesson,_std::allocator<Lesson>_>::emplace_back<Lesson>(local_260,&lesson);
      Lesson::~Lesson(&lesson);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_200);
LAB_00112e19:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&busy_ids.super__Vector_base<int,_std::allocator<int>_>);
      return local_260;
    }
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var8 + 1),lesson_name);
    if (_Var5) {
      std::vector<Lesson,_std::allocator<Lesson>_>::vector
                (&all_lessons_with_this_name,(vector<Lesson,_std::allocator<Lesson>_> *)(p_Var8 + 2)
                );
      std::
      shuffle<__gnu_cxx::__normal_iterator<Lesson*,std::vector<Lesson,std::allocator<Lesson>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                ((__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>)
                 all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>)
                 all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&rng);
      pLVar10 = all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pLVar9 = all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((char)local_24c == '\0') {
        do {
          bVar11 = pLVar9 == pLVar10;
          if (bVar11) break;
          Lesson::Lesson(&lesson,pLVar9);
          bVar1 = true;
          for (piVar7 = busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar7 != busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish; piVar7 = piVar7 + 1) {
            bVar1 = (bool)(bVar1 & CONCAT44(lesson.lesson_id._4_4_,(undefined4)lesson.lesson_id) !=
                                   (long)*piVar7);
          }
          if (bVar1) {
            bVar4 = true;
            std::vector<Lesson,_std::allocator<Lesson>_>::push_back(local_260,&lesson);
          }
          Lesson::~Lesson(&lesson);
          pLVar9 = pLVar9 + 1;
        } while (!bVar1);
      }
      else {
        do {
          if (pLVar9 == pLVar10) {
            bVar11 = false;
            break;
          }
          Lesson::Lesson(&lesson,pLVar9);
          pLVar2 = all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pLVar3 = all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          do {
            pLVar6 = pLVar3;
            if (pLVar6 == pLVar2) {
              bVar11 = false;
              goto LAB_00112c5f;
            }
            Lesson::Lesson(&lesson_2,pLVar6);
            bVar11 = true;
            if ((CONCAT44(lesson_2.lesson_id._4_4_,(undefined4)lesson_2.lesson_id) -
                 CONCAT44(lesson.lesson_id._4_4_,(undefined4)lesson.lesson_id) == 1) &&
               (_Var5 = std::operator==(&lesson.professor,&lesson_2.professor), this = local_260,
               _Var5)) {
              bVar1 = true;
              for (piVar7 = busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  piVar7 != busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish; piVar7 = piVar7 + 1) {
                bVar1 = (bool)(bVar1 & (CONCAT44(lesson_2.lesson_id._4_4_,
                                                 (undefined4)lesson_2.lesson_id) != (long)*piVar7 &&
                                       CONCAT44(lesson.lesson_id._4_4_,(undefined4)lesson.lesson_id)
                                       != (long)*piVar7));
              }
              bVar11 = true;
              if (bVar1) {
                std::vector<Lesson,_std::allocator<Lesson>_>::push_back(local_260,&lesson);
                std::vector<Lesson,_std::allocator<Lesson>_>::push_back(this,&lesson_2);
                bVar4 = true;
                bVar11 = false;
              }
            }
            Lesson::~Lesson(&lesson_2);
            pLVar3 = pLVar6 + 1;
          } while (bVar11);
          bVar11 = true;
LAB_00112c5f:
          Lesson::~Lesson(&lesson);
          pLVar9 = pLVar9 + 1;
        } while (pLVar6 == pLVar2);
        bVar11 = !bVar11;
      }
      std::vector<Lesson,_std::allocator<Lesson>_>::~vector(&all_lessons_with_this_name);
      if (!bVar11) {
        if (!bVar4) {
          std::vector<Lesson,_std::allocator<Lesson>_>::~vector(local_260);
        }
        goto LAB_00112e19;
      }
    }
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

std::vector<Lesson> find_free_spot_for_lesson(Group group, std::string lesson_name, std::map<std::string, std::vector<Lesson>> possible_places, bool doubled) {
    //BUSY IDS
    std::vector<int> busy_ids;
    std::vector<Lesson> new_lessons;
    for (auto lesson:group.lesson_map) {
        if (lesson.subject != "")
            busy_ids.push_back(lesson.lesson_id);
    }

    for(const auto & it: possible_places) {
        if(it.first == lesson_name) {
            std::vector<Lesson> all_lessons_with_this_name = it.second;
            std::shuffle(std::begin(all_lessons_with_this_name), std::end(all_lessons_with_this_name), rng); //shuffle lessons
            if(doubled == false) {
                for (auto lesson:all_lessons_with_this_name) {
                    bool flag = true;
                    for (auto id: busy_ids) {
                       if (lesson.lesson_id == id)
                           flag = false;
                   }
                   if (flag == true) {
                       new_lessons.push_back(lesson);
                        //std::cout<<lesson_name << std::endl;
                        //lesson.print();
                        //std::cout<<lesson.lesson_id<<std::endl;
                        return new_lessons;
                   }

                }
            }
            else {
                for(auto lesson_1: all_lessons_with_this_name) {
                    for(auto lesson_2: all_lessons_with_this_name) {
                        bool flag = true;
                        if (((lesson_2.lesson_id - lesson_1.lesson_id) == 1) && (lesson_1.professor == lesson_2.professor)) {

                            for(auto id: busy_ids) {
                                if ((lesson_1.lesson_id == id) || (lesson_2.lesson_id == id))
                                    flag = false;
                            }
                            if (flag == true) {
                                new_lessons.push_back(lesson_1);
                                new_lessons.push_back(lesson_2);
                                return new_lessons;
                            }
                        }


                    }
                }
            }
        }
    }
    new_lessons.push_back(Lesson());
    return new_lessons;
}